

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

const_pointer __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::data(InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
       *this)

{
  bool bVar1;
  undefined8 local_30;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_local;
  
  bVar1 = allocated(this);
  if (bVar1) {
    local_30 = allocated_space(this);
  }
  else {
    local_30 = inlined_space(this);
  }
  return local_30;
}

Assistant:

const_pointer data() const noexcept {
    return allocated() ? allocated_space() : inlined_space();
  }